

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

void Col_RopeIterBegin(ColRopeIterator *it,Col_Word rope,size_t index)

{
  size_t sVar1;
  
  it->rope = rope;
  sVar1 = Col_RopeLength(rope);
  it->length = sVar1;
  if (sVar1 < index) {
    index = sVar1;
  }
  it->index = index;
  (it->chunk).first = 0xffffffffffffffff;
  return;
}

Assistant:

void
Col_RopeIterBegin(
    Col_RopeIterator it,    /*!< Iterator to initialize. */
    Col_Word rope,          /*!< Rope to iterate over. */
    size_t index)           /*!< Index of first character to iterate. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) {
        Col_RopeIterSetNull(it);
        return;
    }

    it->rope = rope;
    it->length = Col_RopeLength(rope);;
    if (index >= it->length) {
        /*
         * End of rope.
         */

        index = it->length;
    }
    it->index = index;

    /*
     * Traversal info will be lazily computed.
     */

    it->chunk.first = SIZE_MAX;
}